

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nginx.c
# Opt level: O0

ngx_pid_t ngx_exec_new_binary(ngx_cycle_t *cycle,char **argv)

{
  char *pcVar1;
  ngx_log_t *pnVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  long *local_88;
  char **e;
  ngx_listening_t *ls;
  ngx_core_conf_t *ccf;
  ngx_exec_ctx_t ctx;
  ngx_uint_t nStack_48;
  ngx_pid_t pid;
  ngx_uint_t n;
  ngx_uint_t i;
  u_char *p;
  char *var;
  char **env;
  char **argv_local;
  ngx_cycle_t *cycle_local;
  
  env = argv;
  argv_local = (char **)cycle;
  memset(&ccf,0,0x20);
  ccf = (ngx_core_conf_t *)*env;
  ctx.path = "new binary process";
  ctx.name = (char *)env;
  nStack_48 = 2;
  var = (char *)ngx_set_environment((ngx_cycle_t *)argv_local,&stack0xffffffffffffffb8);
  if ((char **)var == (char **)0x0) {
    cycle_local._4_4_ = -1;
  }
  else {
    p = (u_char *)ngx_alloc((long)argv_local[0x18] * 0xc + 8,(ngx_log_t *)argv_local[2]);
    if (p == (u_char *)0x0) {
      free(var);
      cycle_local._4_4_ = -1;
    }
    else {
      builtin_memcpy(p,"NGINX=",6);
      i = (ngx_uint_t)(p + 6);
      pcVar1 = argv_local[0x17];
      for (n = 0; n < argv_local[0x18]; n = n + 1) {
        i = (ngx_uint_t)ngx_sprintf((u_char *)i,"%ud;",(ulong)*(uint *)(pcVar1 + n * 0xe0));
      }
      *(undefined1 *)i = 0;
      lVar5 = nStack_48 + 1;
      *(u_char **)(var + nStack_48 * 8) = p;
      nStack_48 = nStack_48 + 2;
      *(char **)(var + lVar5 * 8) =
           "SPARE=XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
      ;
      pcVar1 = var + nStack_48 * 8;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      for (local_88 = (long *)var; *local_88 != 0; local_88 = local_88 + 1) {
        if ((*(ulong *)argv_local[2] & 0x10) != 0) {
          ngx_log_error_core(8,(ngx_log_t *)argv_local[2],0,"env: %s",*local_88);
        }
      }
      ctx.argv = (char **)var;
      lVar5 = *(long *)(*argv_local + ngx_core_module.index * 8);
      iVar3 = rename(*(char **)(lVar5 + 0x98),*(char **)(lVar5 + 0xa8));
      if (iVar3 == -1) {
        if (1 < *(ulong *)argv_local[2]) {
          pnVar2 = (ngx_log_t *)argv_local[2];
          piVar4 = __errno_location();
          ngx_log_error_core(2,pnVar2,*piVar4,
                             "rename() %s to %s failed before executing new binary process \"%s\"",
                             *(undefined8 *)(lVar5 + 0x98),*(undefined8 *)(lVar5 + 0xa8),*env);
        }
        free(var);
        free(p);
        cycle_local._4_4_ = -1;
      }
      else {
        ctx.envp._4_4_ = ngx_execute((ngx_cycle_t *)argv_local,(ngx_exec_ctx_t *)&ccf);
        if (((ctx.envp._4_4_ == -1) &&
            (iVar3 = rename(*(char **)(lVar5 + 0xa8),*(char **)(lVar5 + 0x98)), iVar3 == -1)) &&
           (1 < *(ulong *)argv_local[2])) {
          pnVar2 = (ngx_log_t *)argv_local[2];
          piVar4 = __errno_location();
          ngx_log_error_core(2,pnVar2,*piVar4,
                             "rename() %s back to %s failed after an attempt to execute new binary process \"%s\""
                             ,*(undefined8 *)(lVar5 + 0xa8),*(undefined8 *)(lVar5 + 0x98),*env);
        }
        free(var);
        free(p);
        cycle_local._4_4_ = ctx.envp._4_4_;
      }
    }
  }
  return cycle_local._4_4_;
}

Assistant:

ngx_pid_t
ngx_exec_new_binary(ngx_cycle_t *cycle, char *const *argv)
{
    char             **env, *var;
    u_char            *p;
    ngx_uint_t         i, n;
    ngx_pid_t          pid;
    ngx_exec_ctx_t     ctx;
    ngx_core_conf_t   *ccf;
    ngx_listening_t   *ls;

    ngx_memzero(&ctx, sizeof(ngx_exec_ctx_t));

    ctx.path = argv[0];
    ctx.name = "new binary process";
    ctx.argv = argv;

    n = 2;
    env = ngx_set_environment(cycle, &n);
    if (env == NULL) {
        return NGX_INVALID_PID;
    }

    var = ngx_alloc(sizeof(NGINX_VAR)
                    + cycle->listening.nelts * (NGX_INT32_LEN + 1) + 2,
                    cycle->log);
    if (var == NULL) {
        ngx_free(env);
        return NGX_INVALID_PID;
    }

    p = ngx_cpymem(var, NGINX_VAR "=", sizeof(NGINX_VAR));

    ls = cycle->listening.elts;
    for (i = 0; i < cycle->listening.nelts; i++) {
        p = ngx_sprintf(p, "%ud;", ls[i].fd);
    }

    *p = '\0';

    env[n++] = var;

#if (NGX_SETPROCTITLE_USES_ENV)

    /* allocate the spare 300 bytes for the new binary process title */

    env[n++] = "SPARE=XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
               "XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
               "XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
               "XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
               "XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX";

#endif

    env[n] = NULL;

#if (NGX_DEBUG)
    {
    char  **e;
    for (e = env; *e; e++) {
        ngx_log_debug1(NGX_LOG_DEBUG_CORE, cycle->log, 0, "env: %s", *e);
    }
    }
#endif

    ctx.envp = (char *const *) env;

    ccf = (ngx_core_conf_t *) ngx_get_conf(cycle->conf_ctx, ngx_core_module);

    if (ngx_rename_file(ccf->pid.data, ccf->oldpid.data) == NGX_FILE_ERROR) {
        ngx_log_error(NGX_LOG_ALERT, cycle->log, ngx_errno,
                      ngx_rename_file_n " %s to %s failed "
                      "before executing new binary process \"%s\"",
                      ccf->pid.data, ccf->oldpid.data, argv[0]);

        ngx_free(env);
        ngx_free(var);

        return NGX_INVALID_PID;
    }

    pid = ngx_execute(cycle, &ctx);

    if (pid == NGX_INVALID_PID) {
        if (ngx_rename_file(ccf->oldpid.data, ccf->pid.data)
            == NGX_FILE_ERROR)
        {
            ngx_log_error(NGX_LOG_ALERT, cycle->log, ngx_errno,
                          ngx_rename_file_n " %s back to %s failed after "
                          "an attempt to execute new binary process \"%s\"",
                          ccf->oldpid.data, ccf->pid.data, argv[0]);
        }
    }

    ngx_free(env);
    ngx_free(var);

    return pid;
}